

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_wstring_append_from_mbs(archive_wstring *dest,char *p,size_t len)

{
  archive_wstring *paVar1;
  size_t sVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  wchar_t *__pwc;
  mbstate_t shift_state;
  
  shift_state.__count = L'\0';
  shift_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  paVar1 = archive_wstring_ensure(dest,len + dest->length + 1);
  if (paVar1 == (archive_wstring *)0x0) {
    wVar3 = L'\xffffffff';
  }
  else {
    pwVar4 = dest->s + dest->length;
    wVar3 = L'\0';
    __pwc = pwVar4;
    while( true ) {
      if ((*p == '\0') || (len == 0)) goto LAB_00150cb6;
      sVar2 = mbrtowc(__pwc,p,len,(mbstate_t *)&shift_state);
      if (0xfffffffffffffffd < sVar2) break;
      if (len <= sVar2 - 1) goto LAB_00150cb6;
      __pwc = __pwc + 1;
      p = p + sVar2;
      len = len - sVar2;
      pwVar4 = pwVar4 + 1;
    }
    wVar3 = L'\xffffffff';
LAB_00150cb6:
    dest->length = (long)pwVar4 - (long)dest->s >> 2;
    *pwVar4 = L'\0';
  }
  return wVar3;
}

Assistant:

int
archive_wstring_append_from_mbs(struct archive_wstring *dest,
    const char *p, size_t len)
{
	size_t r;
	int ret_val = 0;
	/*
	 * No single byte will be more than one wide character,
	 * so this length estimate will always be big enough.
	 */
	// size_t wcs_length = len;
	size_t mbs_length = len;
	const char *mbs = p;
	wchar_t *wcs;
#if HAVE_MBRTOWC
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#endif
	/*
	 * As we decided to have wcs_length == mbs_length == len
	 * we can use len here instead of wcs_length
	 */
	if (NULL == archive_wstring_ensure(dest, dest->length + len + 1))
		return (-1);
	wcs = dest->s + dest->length;
	/*
	 * We cannot use mbsrtowcs/mbstowcs here because those may convert
	 * extra MBS when strlen(p) > len and one wide character consists of
	 * multi bytes.
	 */
	while (*mbs && mbs_length > 0) {
		/*
		 * The buffer we allocated is always big enough.
		 * Keep this code path in a comment if we decide to choose
		 * smaller wcs_length in the future
		 */
/*
		if (wcs_length == 0) {
			dest->length = wcs - dest->s;
			dest->s[dest->length] = L'\0';
			wcs_length = mbs_length;
			if (NULL == archive_wstring_ensure(dest,
			    dest->length + wcs_length + 1))
				return (-1);
			wcs = dest->s + dest->length;
		}
*/
#if HAVE_MBRTOWC
		r = mbrtowc(wcs, mbs, mbs_length, &shift_state);
#else
		r = mbtowc(wcs, mbs, mbs_length);
#endif
		if (r == (size_t)-1 || r == (size_t)-2) {
			ret_val = -1;
			break;
		}
		if (r == 0 || r > mbs_length)
			break;
		wcs++;
		// wcs_length--;
		mbs += r;
		mbs_length -= r;
	}
	dest->length = wcs - dest->s;
	dest->s[dest->length] = L'\0';
	return (ret_val);
}